

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_pointcloud.cpp
# Opt level: O1

int __thiscall ON_PointCloud::RemoveRange(ON_PointCloud *this,int count,int *pIndices)

{
  uint uVar1;
  uint uVar2;
  uint uVar3;
  uint uVar4;
  uint uVar5;
  anon_union_4_2_6147a14e_for_ON_Color_15 aVar6;
  ON_3dPoint *pOVar7;
  double dVar8;
  ON_3dVector *pOVar9;
  ON_Color *pOVar10;
  double *pdVar11;
  bool *pbVar12;
  double dVar13;
  double dVar14;
  double dVar15;
  ulong uVar16;
  uint uVar17;
  long lVar18;
  ulong uVar19;
  int iVar20;
  uint uVar21;
  bool bVar22;
  ON_3dVector t;
  ON_SimpleArray<int> indices;
  ON_SimpleArray<int> local_48;
  
  iVar20 = 0;
  if (((pIndices != (int *)0x0) && (iVar20 = 0, 0 < count)) &&
     (uVar17 = (this->m_P).super_ON_SimpleArray<ON_3dPoint>.m_count, uVar17 != 0)) {
    local_48._vptr_ON_SimpleArray = (_func_int **)&PTR__ON_SimpleArray_008176a8;
    local_48.m_a = (int *)0x0;
    local_48.m_count = 0;
    local_48.m_capacity = 0;
    ON_SimpleArray<int>::SetCapacity(&local_48,(ulong)(uint)count);
    ON_SimpleArray<int>::Append(&local_48,count,pIndices);
    ON_SimpleArray<int>::QuickSortAndRemoveDuplicates(&local_48,ON_CompareDecreasing<int>);
    if ((local_48._16_8_ & 0xffffffff) == 0) {
      iVar20 = 0;
    }
    else {
      uVar1 = (this->m_N).m_count;
      uVar2 = (this->m_C).m_count;
      uVar3 = (this->m_V).m_count;
      uVar4 = (this->m_H).m_count;
      iVar20 = 0;
      lVar18 = 0;
      uVar21 = uVar17;
      do {
        uVar5 = local_48.m_a[lVar18];
        if (uVar5 < uVar17) {
          uVar21 = uVar21 - 1;
          if (uVar5 != uVar21) {
            pOVar7 = (this->m_P).super_ON_SimpleArray<ON_3dPoint>.m_a;
            dVar8 = pOVar7[(int)uVar5].z;
            dVar13 = pOVar7[(int)uVar5].x;
            dVar14 = pOVar7[(int)uVar5].y;
            dVar15 = pOVar7[(int)uVar21].y;
            pOVar7[(int)uVar5].x = pOVar7[(int)uVar21].x;
            pOVar7[(int)uVar5].y = dVar15;
            pOVar7[(int)uVar5].z = pOVar7[(int)uVar21].z;
            pOVar7 = (this->m_P).super_ON_SimpleArray<ON_3dPoint>.m_a;
            pOVar7[(int)uVar21].z = dVar8;
            pOVar7 = pOVar7 + (int)uVar21;
            pOVar7->x = dVar13;
            pOVar7->y = dVar14;
          }
          if ((uVar17 == uVar1) && (uVar5 != uVar21)) {
            pOVar9 = (this->m_N).m_a;
            dVar8 = pOVar9[(int)uVar5].z;
            dVar13 = pOVar9[(int)uVar5].x;
            dVar14 = pOVar9[(int)uVar5].y;
            dVar15 = pOVar9[(int)uVar21].y;
            pOVar9[(int)uVar5].x = pOVar9[(int)uVar21].x;
            pOVar9[(int)uVar5].y = dVar15;
            pOVar9[(int)uVar5].z = pOVar9[(int)uVar21].z;
            pOVar9 = (this->m_N).m_a;
            pOVar9[(int)uVar21].z = dVar8;
            pOVar9 = pOVar9 + (int)uVar21;
            pOVar9->x = dVar13;
            pOVar9->y = dVar14;
          }
          if ((uVar17 == uVar2) && (uVar5 != uVar21)) {
            pOVar10 = (this->m_C).m_a;
            aVar6 = pOVar10[(int)uVar5].field_0;
            pOVar10[(int)uVar5].field_0 = pOVar10[(int)uVar21].field_0;
            (this->m_C).m_a[(int)uVar21].field_0 = aVar6;
          }
          if ((uVar17 == uVar3) && (uVar5 != uVar21)) {
            pdVar11 = (this->m_V).m_a;
            dVar8 = pdVar11[(int)uVar5];
            pdVar11[(int)uVar5] = pdVar11[(int)uVar21];
            pdVar11[(int)uVar21] = dVar8;
          }
          if ((uVar17 == uVar4) && (uVar5 != uVar21)) {
            pbVar12 = (this->m_H).m_a;
            bVar22 = pbVar12[(int)uVar5];
            pbVar12[(int)uVar5] = pbVar12[(int)uVar21];
            pbVar12[(int)uVar21] = bVar22;
          }
          iVar20 = iVar20 + 1;
          bVar22 = uVar21 == 0;
        }
        else {
          bVar22 = false;
        }
      } while ((!bVar22) &&
              (bVar22 = (local_48._16_8_ & 0xffffffff) - 1 != lVar18, lVar18 = lVar18 + 1, bVar22));
      if ((-1 < (int)uVar21) &&
         ((int)uVar21 <= (this->m_P).super_ON_SimpleArray<ON_3dPoint>.m_capacity)) {
        (this->m_P).super_ON_SimpleArray<ON_3dPoint>.m_count = uVar21;
      }
      ON_SimpleArray<ON_3dPoint>::SetCapacity
                (&(this->m_P).super_ON_SimpleArray<ON_3dPoint>,
                 (long)(this->m_P).super_ON_SimpleArray<ON_3dPoint>.m_count);
      if (uVar17 == uVar1) {
        if ((-1 < (int)uVar21) && ((int)uVar21 <= (this->m_N).m_capacity)) {
          (this->m_N).m_count = uVar21;
        }
        ON_SimpleArray<ON_3dVector>::SetCapacity(&this->m_N,(long)(this->m_N).m_count);
      }
      if (uVar17 == uVar2) {
        if ((-1 < (int)uVar21) && ((int)uVar21 <= (this->m_C).m_capacity)) {
          (this->m_C).m_count = uVar21;
        }
        ON_SimpleArray<ON_Color>::SetCapacity(&this->m_C,(long)(this->m_C).m_count);
      }
      if (uVar17 == uVar3) {
        if ((-1 < (int)uVar21) && ((int)uVar21 <= (this->m_V).m_capacity)) {
          (this->m_V).m_count = uVar21;
        }
        ON_SimpleArray<double>::SetCapacity(&this->m_V,(long)(this->m_V).m_count);
      }
      if (uVar17 == uVar4) {
        if ((-1 < (int)uVar21) && ((int)uVar21 <= (this->m_H).m_capacity)) {
          (this->m_H).m_count = uVar21;
        }
        ON_SimpleArray<bool>::SetCapacity(&this->m_H,(long)(this->m_H).m_count);
        this->m_hidden_count = 0;
        uVar16 = (ulong)(uint)(this->m_H).m_count;
        if (uVar16 != 0) {
          uVar17 = this->m_hidden_count;
          pbVar12 = (this->m_H).m_a;
          uVar19 = 0;
          do {
            if (pbVar12[uVar19] == true) {
              uVar17 = uVar17 + 1;
              this->m_hidden_count = uVar17;
            }
            uVar19 = uVar19 + 1;
          } while (uVar16 != uVar19);
        }
        ON_BoundingBox::Destroy(&this->m_bbox);
      }
    }
    ON_SimpleArray<int>::~ON_SimpleArray(&local_48);
  }
  return iVar20;
}

Assistant:

int ON_PointCloud::RemoveRange(int count, const int* pIndices)
{
  const unsigned int point_count = m_P.UnsignedCount();
  if (0 == point_count || count <= 0 || nullptr == pIndices)
    return 0;

  ON_SimpleArray<int> indices(count);
  indices.Append(count, pIndices);
  indices.QuickSortAndRemoveDuplicates(ON_CompareDecreasing<int>);

  const unsigned int index_count = indices.Count();
  if (index_count <= 0)
    return 0;

  const bool bHaveNormals = point_count == m_N.UnsignedCount();
  const bool bHaveColors = point_count == m_C.UnsignedCount();
  const bool bHaveValues = point_count == m_V.UnsignedCount();
  const bool bHaveHidden = point_count == m_H.UnsignedCount();

  unsigned int points_removed = 0;
  unsigned int last_point_count = point_count;
  for (unsigned int i = 0; i < index_count; i++)
  {
    const unsigned int point_index = indices[i];
    if (point_index >= 0 && point_index < point_count)
    {
      m_P.Swap(point_index, last_point_count - 1);
      if (bHaveNormals)
        m_N.Swap(point_index, last_point_count - 1);
      if (bHaveColors)
        m_C.Swap(point_index, last_point_count - 1);
      if (bHaveValues)
        m_V.Swap(point_index, last_point_count - 1);
      if (bHaveHidden)
        m_H.Swap(point_index, last_point_count - 1);

      points_removed++;
      last_point_count--;
      if (last_point_count <= 0)
        break;
    }
  }

  m_P.SetCount(last_point_count);
  m_P.Shrink();
  if (bHaveNormals)
  {
    m_N.SetCount(last_point_count);
    m_N.Shrink();
  }
  if (bHaveColors)
  {
    m_C.SetCount(last_point_count);
    m_C.Shrink();
  }
  if (bHaveValues)
  {
    m_V.SetCount(last_point_count);
    m_V.Shrink();
  }
  if (bHaveHidden)
  {
    m_H.SetCount(last_point_count);
    m_H.Shrink();
    m_hidden_count = 0;
    for (unsigned int i = 0; i < m_H.UnsignedCount(); i++)
    {
      if (m_H[i])
        m_hidden_count++;
    }
    InvalidateBoundingBox();
  }

  return points_removed;
}